

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int findLocation(string *str,int begin,int end,char op)

{
  char cVar1;
  long lVar2;
  runtime_error *this;
  int iVar3;
  
  lVar2 = (long)end;
  iVar3 = 0;
LAB_00107200:
  do {
    if (lVar2 <= begin) {
      if (iVar3 < 1) {
        return end;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"parentheses mismatch");
LAB_0010727a:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = (str->_M_dataplus)._M_p[lVar2 + -1];
    if (cVar1 == '(') {
      if (iVar3 < 1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"parentheses mismatch");
        goto LAB_0010727a;
      }
      iVar3 = iVar3 + -1;
LAB_0010722f:
      lVar2 = lVar2 + -1;
      goto LAB_00107200;
    }
    if (cVar1 == ')') {
      iVar3 = iVar3 + 1;
      goto LAB_0010722f;
    }
    lVar2 = lVar2 + -1;
    if ((iVar3 < 1) && (cVar1 == op)) {
      return (int)lVar2;
    }
  } while( true );
}

Assistant:

int findLocation(const std::string& str, int begin, int end, char op)
{
  int level = 0;
  for (int i=end-1; i>=begin; --i) {
    char c = str[i];
    if (c == ')') {
      ++level;
      continue;
    }
    if (c == '(') {
      --level;
      if (level < 0)
        throw std::runtime_error("parentheses mismatch");
      continue;
    }
    if (level > 0) continue;
    if (c == op)
      return i;
  }
  if (level > 0) throw std::runtime_error("parentheses mismatch");
  return end;
}